

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryInt::test
          (ShaderBitfieldOperationCaseUnaryInt *this,Data *data)

{
  int iVar1;
  long lVar2;
  GLint GVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    iVar1 = this->m_components;
    if (iVar1 <= lVar4) break;
    GVar3 = (*this->m_func)(data->inIvec4[lVar4]);
    lVar2 = lVar4 + 1;
  } while (data->outIvec4[lVar4] == GVar3);
  return iVar1 <= lVar4;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = m_func(data->inIvec4[i]);
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}